

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_parser_parseTokens
          (sysbvm_context_t *context,sysbvm_tuple_t sourceCode,sysbvm_tuple_t tokenSequence)

{
  undefined1 local_68 [8];
  sysbvm_parser_state_t parserState;
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_8_1_6971b95b gcFrame;
  sysbvm_tuple_t tokenSequence_local;
  sysbvm_tuple_t sourceCode_local;
  sysbvm_context_t *context_local;
  
  memset(&gcFrameRecord.roots,0,8);
  memset(&parserState.tokenSequenceSize,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_FUNCTION_ACTIVATION;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&parserState.tokenSequenceSize);
  sysbvm_gc_lock(context);
  parserState.tokenSequence = 0;
  local_68 = (undefined1  [8])sourceCode;
  parserState.sourceCode = tokenSequence;
  parserState.tokenPosition = sysbvm_arraySlice_getSize(tokenSequence);
  gcFrameRecord.roots =
       (sysbvm_tuple_t *)sysbvm_parser_parseSequence(context,(sysbvm_parser_state_t *)local_68);
  sysbvm_gc_unlock(context);
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&parserState.tokenSequenceSize);
  return (sysbvm_tuple_t)gcFrameRecord.roots;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_parser_parseTokens(sysbvm_context_t *context, sysbvm_tuple_t sourceCode, sysbvm_tuple_t tokenSequence)
{
    struct {
        sysbvm_tuple_t result;
    } gcFrame = {0};

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    sysbvm_gc_lock(context);
    sysbvm_parser_state_t parserState = {
        .sourceCode = sourceCode,
        .tokenSequence = tokenSequence,
        .tokenPosition = 0,
        .tokenSequenceSize = sysbvm_arraySlice_getSize(tokenSequence),
    };

    gcFrame.result = sysbvm_parser_parseSequence(context, &parserState);
    sysbvm_gc_unlock(context);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}